

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TTypeList * __thiscall
glslang::TParseContext::recordStructCopy
          (TParseContext *this,TStructRecord *record,TType *originType,TType *tmpType)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  byte bVar3;
  mapped_type pTVar4;
  TStructRecord *this_00;
  TType *pTVar5;
  int iVar6;
  ulong uVar7;
  _Base_ptr p_Var8;
  mapped_type *pmVar9;
  mapped_type *ppTVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  TTypeList *originStruct;
  long local_a8;
  _Base_ptr local_a0;
  ulong local_98;
  TStructRecord *local_90;
  ulong local_88;
  TType *local_80;
  ulong local_78;
  ulong local_70;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
  local_68;
  
  iVar6 = (*tmpType->_vptr_TType[0x25])(tmpType);
  if ((char)iVar6 == '\0') {
LAB_00434e9e:
    __assert_fail("isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
  }
  lVar13 = (long)(((tmpType->field_13).referentType)->qualifier).semanticName -
           *(long *)&((tmpType->field_13).referentType)->field_0x8;
  local_90 = record;
  if (lVar13 == 0) {
    uVar7 = 0;
    uVar15 = 0;
  }
  else {
    lVar13 = lVar13 >> 5;
    local_88 = lVar13 + (ulong)(lVar13 == 0);
    local_a8 = 0;
    uVar15 = 0;
    uVar14 = 0;
    uVar7 = 0;
    local_80 = originType;
    do {
      pTVar5 = local_80;
      local_78 = uVar15;
      local_70 = uVar7;
      iVar6 = (*local_80->_vptr_TType[0x25])(local_80);
      if ((char)iVar6 == '\0') goto LAB_00434e9e;
      lVar13 = *(long *)&((pTVar5->field_13).referentType)->field_0x8;
      if ((ulong)((long)(((pTVar5->field_13).referentType)->qualifier).semanticName - lVar13 >> 5)
          <= uVar14) {
LAB_00434ebd:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar14);
      }
      lVar13 = (**(code **)(**(long **)(lVar13 + local_a8) + 0x50))();
      bVar2 = *(byte *)(lVar13 + 0x10);
      iVar6 = (*pTVar5->_vptr_TType[0x25])(pTVar5);
      if ((char)iVar6 == '\0') goto LAB_00434e9e;
      lVar13 = *(long *)&((pTVar5->field_13).referentType)->field_0x8;
      if ((ulong)((long)(((pTVar5->field_13).referentType)->qualifier).semanticName - lVar13 >> 5)
          <= uVar14) goto LAB_00434ebd;
      lVar13 = (**(code **)(**(long **)(lVar13 + local_a8) + 0x50))();
      uVar15 = *(ulong *)(lVar13 + 8);
      iVar6 = (*tmpType->_vptr_TType[0x25])(tmpType);
      if ((char)iVar6 == '\0') goto LAB_00434e9e;
      lVar13 = *(long *)&((tmpType->field_13).referentType)->field_0x8;
      if ((ulong)((long)(((tmpType->field_13).referentType)->qualifier).semanticName - lVar13 >> 5)
          <= uVar14) goto LAB_00434ebd;
      lVar13 = (**(code **)(**(long **)(lVar13 + local_a8) + 0x50))();
      bVar3 = *(byte *)(lVar13 + 0x10);
      iVar6 = (*tmpType->_vptr_TType[0x25])(tmpType);
      if ((char)iVar6 == '\0') goto LAB_00434e9e;
      lVar13 = *(long *)&((tmpType->field_13).referentType)->field_0x8;
      if ((ulong)((long)(((tmpType->field_13).referentType)->qualifier).semanticName - lVar13 >> 5)
          <= uVar14) goto LAB_00434ebd;
      uVar15 = (uVar15 >> 0x3d) + (ulong)(bVar2 & 0xf) ^ local_78;
      lVar13 = (**(code **)(**(long **)(lVar13 + local_a8) + 0x50))();
      uVar15 = uVar15 * 2;
      uVar7 = ((*(ulong *)(lVar13 + 8) >> 0x3d) + (ulong)(bVar3 & 0xf) ^ local_70) * 2;
      uVar14 = uVar14 + 1;
      local_a8 = local_a8 + 0x20;
      originType = local_80;
    } while (local_88 != uVar14);
  }
  local_98 = uVar7;
  iVar6 = (*originType->_vptr_TType[0x25])(originType);
  if ((char)iVar6 == '\0') goto LAB_00434e9e;
  p_Var12 = (_Base_ptr)(originType->field_13).structure;
  local_a0 = p_Var12;
  iVar6 = (*tmpType->_vptr_TType[0x25])(tmpType);
  this_00 = local_90;
  if ((char)iVar6 == '\0') goto LAB_00434e9e;
  if (uVar15 == uVar7) {
    return (TTypeList *)p_Var12;
  }
  pTVar4 = (tmpType->field_13).structure;
  p_Var11 = (local_90->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var11 != (_Base_ptr)0x0) {
    p_Var1 = &(local_90->_M_t)._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    do {
      if (*(_Base_ptr *)(p_Var11 + 1) >= p_Var12) {
        p_Var8 = p_Var11;
      }
      p_Var11 = (&p_Var11->_M_left)[*(_Base_ptr *)(p_Var11 + 1) < p_Var12];
    } while (p_Var11 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var8 != p_Var1) && (*(_Base_ptr *)(p_Var8 + 1) <= p_Var12)) {
      p_Var12 = p_Var8[1]._M_right;
      if (p_Var12 != (_Base_ptr)0x0) {
        p_Var11 = (_Base_ptr)&p_Var8[1]._M_left;
        do {
          if (*(ulong *)(p_Var12 + 1) >= uVar7) {
            p_Var11 = p_Var12;
          }
          p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < uVar7];
        } while (p_Var12 != (_Base_ptr)0x0);
        if ((p_Var11 != (_Base_ptr)&p_Var8[1]._M_left) && (*(ulong *)(p_Var11 + 1) <= uVar7)) {
          return (TTypeList *)p_Var11[1]._M_parent;
        }
      }
      goto LAB_00434e34;
    }
  }
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar9 = std::
           map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
           ::operator[](local_90,(key_type *)&local_a0);
  std::
  map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
  ::operator=(pmVar9,(map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                      *)&local_68);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
  ::_M_erase(&local_68,(_Link_type)local_68._M_impl.super__Rb_tree_header._M_header._M_parent);
LAB_00434e34:
  pmVar9 = std::
           map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
           ::operator[](this_00,(key_type *)&local_a0);
  ppTVar10 = std::
             map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
             ::operator[](pmVar9,&local_98);
  *ppTVar10 = pTVar4;
  return pTVar4;
}

Assistant:

const TTypeList* TParseContext::recordStructCopy(TStructRecord& record, const TType* originType, const TType* tmpType)
{
    size_t memberCount = tmpType->getStruct()->size();
    size_t originHash = 0, tmpHash = 0;
    std::hash<size_t> hasher;
    for (size_t i = 0; i < memberCount; i++) {
        size_t originMemberHash = hasher(originType->getStruct()->at(i).type->getQualifier().layoutPacking +
                                         originType->getStruct()->at(i).type->getQualifier().layoutMatrix);
        size_t tmpMemberHash = hasher(tmpType->getStruct()->at(i).type->getQualifier().layoutPacking +
                                      tmpType->getStruct()->at(i).type->getQualifier().layoutMatrix);
        originHash = hasher((originHash ^ originMemberHash) << 1);
        tmpHash = hasher((tmpHash ^ tmpMemberHash) << 1);
    }
    const TTypeList* originStruct = originType->getStruct();
    const TTypeList* tmpStruct = tmpType->getStruct();
    if (originHash != tmpHash) {
        auto fixRecords = record.find(originStruct);
        if (fixRecords != record.end()) {
            auto fixRecord = fixRecords->second.find(tmpHash);
            if (fixRecord != fixRecords->second.end()) {
                return fixRecord->second;
            } else {
                record[originStruct][tmpHash] = tmpStruct;
                return tmpStruct;
            }
        } else {
            record[originStruct] = std::map<size_t, const TTypeList*>();
            record[originStruct][tmpHash] = tmpStruct;
            return tmpStruct;
        }
    }
    return originStruct;
}